

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O2

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromUrl
          (IFilePartLoader *this,URI *url,ClassId classId,bool isAbsolute)

{
  int iVar1;
  undefined4 extraout_var;
  UniqueId *pUVar2;
  undefined4 extraout_var_00;
  String *uriStr;
  undefined4 extraout_var_01;
  undefined3 in_register_00000009;
  URI absoluteUri;
  URI UStack_108;
  
  if (CONCAT31(in_register_00000009,isAbsolute) != 0) {
    iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[7])(this);
    pUVar2 = Loader::getUniqueId((Loader *)CONCAT44(extraout_var,iVar1),url,classId);
    return pUVar2;
  }
  iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[0xb])(this);
  uriStr = COLLADABU::URI::getURIString_abi_cxx11_(url);
  COLLADABU::URI::URI(&UStack_108,(URI *)CONCAT44(extraout_var_00,iVar1),uriStr);
  iVar1 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[7])(this);
  pUVar2 = Loader::getUniqueId((Loader *)CONCAT44(extraout_var_01,iVar1),&UStack_108,classId);
  COLLADABU::URI::~URI(&UStack_108);
  return pUVar2;
}

Assistant:

const COLLADAFW::UniqueId& IFilePartLoader::createUniqueIdFromUrl( const COLLADABU::URI& url, COLLADAFW::ClassId classId, bool isAbsolute  )
	{
		COLLADABU_ASSERT( getColladaLoader() );

		if ( isAbsolute )
		{
			return getColladaLoader()->getUniqueId(url, classId);
		}
		else
		{
			COLLADABU::URI absoluteUri(getFileUri(), url.getURIString());

			return getColladaLoader()->getUniqueId(absoluteUri, classId);
		}
	}